

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_resolve.cpp
# Opt level: O3

void __thiscall tst_helpers_resolve::voidFuture(tst_helpers_resolve *this)

{
  QSharedData *pQVar1;
  int *piVar2;
  long lVar3;
  long *plVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  PromiseData<void> *pPVar8;
  PromiseData<void> *pPVar9;
  PromiseData<void> *pPVar10;
  char *pcVar11;
  char *pcVar12;
  anon_class_1_0_00000001_for__M_head_impl *in_RDX;
  anon_class_1_0_00000001_for__M_head_impl *f;
  long lVar13;
  QtConcurrent *in_RSI;
  QFutureInterfaceBase *this_00;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e0;
  QSharedData *local_d8;
  PromiseResolver<void> resolver_1;
  QSharedData *apQStack_c8 [2];
  QPromise<void> local_b8;
  _func_int **local_a8;
  PromiseData<void> *local_a0;
  _func_int **local_98;
  PromiseData<void> *local_90;
  PromiseData<void> *local_88;
  PromiseData<void> *local_80;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_78;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_70;
  _func_int **local_68;
  PromiseData<void> *local_60;
  QSharedData *local_58;
  QFuture<void> v1;
  QFuture<void> v0;
  
  this_00 = &v0.d;
  QtConcurrent::run<tst_helpers_resolve::voidFuture()::__0&>((QFuture<void> *)this_00,in_RSI,in_RDX)
  ;
  QFutureInterfaceBase::QFutureInterfaceBase(&v1.d,this_00);
  QtConcurrent::run<tst_helpers_resolve::voidFuture()::__0&>
            ((QFuture<void> *)&resolver_1,(QtConcurrent *)this_00,f);
  pPVar8 = (PromiseData<void> *)operator_new(0x58);
  (pPVar8->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar8->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar8->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00123568;
  QReadWriteLock::QReadWriteLock(&(pPVar8->super_PromiseDataBase<void,_void_()>).m_lock,0);
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_settled = false;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_001234f0;
  LOCK();
  pQVar1 = &(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar1 = &(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_d8 = &(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  local_68 = (_func_int **)&PTR__QPromiseBase_00123488;
  local_b8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00123488;
  local_b8.super_QPromiseBase<void>.m_d.d = pPVar8;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,&local_b8);
  local_b8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001234d0;
  if (local_b8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_b8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_b8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_b8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver.m_d.d == (Data *)0x0) {
    local_e0.d = (Data *)0x0;
LAB_0010afb4:
    local_78.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_e0 = resolver.m_d.d;
    if (resolver.m_d.d == (Data *)0x0) goto LAB_0010afb4;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_78 = resolver.m_d.d;
  }
  QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
            ((QFuture<void> *)&resolver_1,(QPromiseResolve<void> *)&local_e0,
             (QPromiseReject<void> *)&local_78);
  if (local_78.d != (Data *)0x0) {
    LOCK();
    ((local_78.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_78.d,0x10);
    }
  }
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_e0.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  QFutureInterfaceBase::~QFutureInterfaceBase((QFutureInterfaceBase *)&resolver_1);
  local_80 = pPVar8;
  pPVar9 = (PromiseData<void> *)operator_new(0x58);
  (pPVar9->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar9->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar9->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00123568;
  QReadWriteLock::QReadWriteLock(&(pPVar9->super_PromiseDataBase<void,_void_()>).m_lock,0);
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_settled = false;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_001234f0;
  LOCK();
  pQVar1 = &(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  apQStack_c8[1] = &(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  LOCK();
  pQVar1 = &(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_b8.super_QPromiseBase<void>._vptr_QPromiseBase = local_68;
  local_b8.super_QPromiseBase<void>.m_d.d = pPVar9;
  local_88 = pPVar9;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,&local_b8);
  local_b8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001234d0;
  if (local_b8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_b8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_b8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_b8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  resolver.m_d.d._4_4_ = resolver_1.m_d.d._4_4_;
  resolver.m_d.d._0_4_ = resolver_1.m_d.d._0_4_;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
LAB_0010b113:
    local_70.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_70.d = (Data *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_);
    if (local_70.d == (Data *)0x0) goto LAB_0010b113;
    LOCK();
    ((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
            (&v0,(QPromiseResolve<void> *)&resolver,(QPromiseReject<void> *)&local_70);
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_70.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  piVar2 = (int *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete((void *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_),0x10);
    }
  }
  pPVar10 = (PromiseData<void> *)operator_new(0x58);
  (pPVar10->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00123568;
  QReadWriteLock::QReadWriteLock(&(pPVar10->super_PromiseDataBase<void,_void_()>).m_lock,0);
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_settled = false;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_001234f0;
  LOCK();
  pQVar1 = &(pPVar10->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_58 = &(pPVar10->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  LOCK();
  pQVar1 = &(pPVar10->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_b8.super_QPromiseBase<void>._vptr_QPromiseBase = local_68;
  local_b8.super_QPromiseBase<void>.m_d.d = pPVar10;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,&local_b8);
  local_b8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001234d0;
  if (local_b8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_b8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_b8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_b8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  resolver.m_d.d._4_4_ = resolver_1.m_d.d._4_4_;
  resolver.m_d.d._0_4_ = resolver_1.m_d.d._0_4_;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_e0.d = (Data *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_);
    if (local_e0.d != (Data *)0x0) {
      LOCK();
      ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int>._M_i =
           ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      goto LAB_0010b269;
    }
  }
  local_e0.d = (Data *)0x0;
LAB_0010b269:
  QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
            (&v1,(QPromiseResolve<void> *)&resolver,(QPromiseReject<void> *)&local_e0);
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_e0.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  piVar2 = (int *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete((void *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_),0x10);
    }
  }
  local_b8.super_QPromiseBase<void>.m_d.d = pPVar8;
  LOCK();
  pQVar1 = &(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_b8.super_QPromiseBase<void>._vptr_QPromiseBase = local_68;
  local_a0 = pPVar9;
  LOCK();
  pQVar1 = &(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_a8 = local_68;
  local_90 = pPVar10;
  local_60 = pPVar10;
  LOCK();
  pQVar1 = &(pPVar10->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_98 = local_68;
  lVar13 = 8;
  do {
    bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                      (*(PromiseDataBase<void,_void_()> **)
                        ((long)&local_b8.super_QPromiseBase<void>._vptr_QPromiseBase + lVar13));
    resolver_1.m_d.d._0_1_ = bVar5;
    resolver.m_d.d._0_1_ = 1;
    pcVar11 = QTest::toString<bool>((bool *)&resolver_1);
    pcVar12 = QTest::toString<bool>((bool *)&resolver);
    bVar6 = QTest::compare_helper
                      (bVar5,"Compared values are not the same",pcVar11,pcVar12,
                       "promise.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_resolve.cpp"
                       ,0x10e);
    pPVar9 = local_80;
    pPVar8 = local_88;
    bVar5 = lVar13 != 0x28;
    lVar13 = lVar13 + 0x10;
  } while ((bVar6 & bVar5) != 0);
  lVar13 = 0x30;
  do {
    *(undefined ***)((long)apQStack_c8 + lVar13) = &PTR__QPromiseBase_001234d0;
    lVar3 = *(long *)((long)apQStack_c8 + lVar13 + 8);
    if (lVar3 != 0) {
      LOCK();
      piVar2 = (int *)(lVar3 + 8);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) &&
         (plVar4 = *(long **)((long)apQStack_c8 + lVar13 + 8), plVar4 != (long *)0x0)) {
        (**(code **)(*plVar4 + 8))();
      }
    }
    lVar13 = lVar13 + -0x10;
  } while (lVar13 != 0);
  if (bVar6 != 0) {
    local_b8.super_QPromiseBase<void>.m_d.d = pPVar9;
    LOCK();
    pQVar1 = &(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_b8.super_QPromiseBase<void>._vptr_QPromiseBase = local_68;
    local_a0 = pPVar8;
    LOCK();
    pQVar1 = &(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_a8 = local_68;
    local_90 = local_60;
    LOCK();
    pQVar1 = &(local_60->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_98 = local_68;
    lVar13 = 0;
    do {
      resolver_1.m_d.d._0_4_ = 0x2a;
      iVar7 = waitForValue<int>((QPromise<void> *)
                                ((long)&local_b8.super_QPromiseBase<void>._vptr_QPromiseBase +
                                lVar13),(int *)0xffffffff,(int *)&resolver_1);
      bVar6 = QTest::qCompare(iVar7,0x2a,"waitForValue(promise, -1, 42)","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_resolve.cpp"
                              ,0x111);
      pPVar9 = local_80;
      pPVar8 = local_88;
      bVar5 = lVar13 != 0x20;
      lVar13 = lVar13 + 0x10;
    } while ((bVar6 & bVar5) != 0);
    lVar13 = 0x30;
    do {
      *(undefined ***)((long)apQStack_c8 + lVar13) = &PTR__QPromiseBase_001234d0;
      lVar3 = *(long *)((long)apQStack_c8 + lVar13 + 8);
      if (lVar3 != 0) {
        LOCK();
        piVar2 = (int *)(lVar3 + 8);
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) &&
           (plVar4 = *(long **)((long)apQStack_c8 + lVar13 + 8), plVar4 != (long *)0x0)) {
          (**(code **)(*plVar4 + 8))();
        }
      }
      lVar13 = lVar13 + -0x10;
    } while (lVar13 != 0);
  }
  LOCK();
  (local_58->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_58->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_58->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(local_60->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])();
  }
  LOCK();
  (apQStack_c8[1]->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (apQStack_c8[1]->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((apQStack_c8[1]->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(pPVar8->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])(pPVar8);
  }
  LOCK();
  (local_d8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_d8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_d8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(pPVar9->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])(pPVar9);
  }
  QFutureInterfaceBase::~QFutureInterfaceBase(&v1.d);
  QFutureInterfaceBase::~QFutureInterfaceBase(&v0.d);
  return;
}

Assistant:

void tst_helpers_resolve::voidFuture()
{
    auto fn = []() {};
    QFuture<void> v0 = QtConcurrent::run(fn);
    const QFuture<void> v1 = v0;

    auto p0 = QtPromise::resolve(QtConcurrent::run(fn));
    auto p1 = QtPromise::resolve(v0);
    auto p2 = QtPromise::resolve(v1);

    Q_STATIC_ASSERT((std::is_same<decltype(p0), QtPromise::QPromise<void>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p1), QtPromise::QPromise<void>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p2), QtPromise::QPromise<void>>::value));

    for (const auto& promise : {p0, p1, p2}) {
        QCOMPARE(promise.isPending(), true);
    }
    for (const auto& promise : {p0, p1, p2}) {
        QCOMPARE(waitForValue(promise, -1, 42), 42);
    }
}